

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void checkPtrmap(IntegrityCk *pCheck,Pgno iChild,u8 eType,Pgno iParent)

{
  int iVar1;
  long in_FS_OFFSET;
  Pgno iPtrmapParent;
  u8 ePtrmapType;
  Pgno local_30;
  byte local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_29 = 0xaa;
  local_30 = 0xaaaaaaaa;
  iVar1 = ptrmapGet(pCheck->pBt,iChild,&local_29,&local_30);
  if (iVar1 == 0) {
    if (local_29 != eType || local_30 != iParent) {
      checkAppendMsg(pCheck,"Bad ptr map entry key=%u expected=(%u,%u) got=(%u,%u)",iChild,
                     (ulong)eType,(ulong)iParent,(ulong)local_29,local_30);
    }
  }
  else {
    if ((iVar1 == 0xc0a) || (iVar1 == 7)) {
      pCheck->rc = 7;
      pCheck->mxErr = 0;
      if (pCheck->nErr == 0) {
        pCheck->nErr = 1;
      }
    }
    checkAppendMsg(pCheck,"Failed to read ptrmap key=%u",iChild);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void checkPtrmap(
  IntegrityCk *pCheck,   /* Integrity check context */
  Pgno iChild,           /* Child page number */
  u8 eType,              /* Expected pointer map type */
  Pgno iParent           /* Expected pointer map parent page number */
){
  int rc;
  u8 ePtrmapType;
  Pgno iPtrmapParent;

  rc = ptrmapGet(pCheck->pBt, iChild, &ePtrmapType, &iPtrmapParent);
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ) checkOom(pCheck);
    checkAppendMsg(pCheck, "Failed to read ptrmap key=%u", iChild);
    return;
  }

  if( ePtrmapType!=eType || iPtrmapParent!=iParent ){
    checkAppendMsg(pCheck,
      "Bad ptr map entry key=%u expected=(%u,%u) got=(%u,%u)",
      iChild, eType, iParent, ePtrmapType, iPtrmapParent);
  }
}